

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakeDepend.cxx
# Opt level: O3

void __thiscall
cmMakeDepend::GenerateDependInformation(cmMakeDepend *this,cmDependInformation *info)

{
  char *filename;
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  cmSourceFile *pcVar6;
  string *psVar7;
  size_type sVar8;
  undefined8 unaff_RBP;
  cmSourceFile *cFile;
  const_iterator file;
  pointer pbVar9;
  string incpath;
  string local_88;
  uint local_64;
  string local_60;
  string *local_40;
  cmSourceFile *local_38;
  
  if (info->DependDone == false) {
    info->DependDone = true;
    filename = (info->FullPath)._M_dataplus._M_p;
    if (filename == (char *)0x0) {
      cmSystemTools::Error
                ("Attempt to find dependencies for file without path!",(char *)0x0,(char *)0x0,
                 (char *)0x0);
      return;
    }
    bVar2 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar2) {
      (*this->_vptr_cmMakeDepend[4])(this,info);
      local_64 = (uint)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    }
    else {
      local_64 = 0;
    }
    pcVar6 = info->SourceFile;
    if ((pcVar6 == (cmSourceFile *)0x0) ||
       (pbVar9 = (pcVar6->Depends).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       pbVar9 == (pcVar6->Depends).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      local_40 = (string *)&info->FullPath;
      if ((char)local_64 == '\0') {
        this_00 = this->Makefile;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        sVar5 = strlen(filename);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,filename,filename + sVar5);
        cmsys::SystemTools::GetFilenameWithoutExtension(&local_60,&local_88);
        pcVar6 = cmMakefile::GetSource(this_00,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (pcVar6 != (cmSourceFile *)0x0) {
          psVar7 = cmSourceFile::GetFullPath(pcVar6,(string *)0x0);
          iVar3 = std::__cxx11::string::compare((char *)psVar7);
          if (iVar3 == 0) {
            return;
          }
          pbVar9 = (this->IncludeDirectories).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pbVar9 != (this->IncludeDirectories).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            local_38 = pcVar6;
            do {
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              pcVar1 = (pbVar9->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_60,pcVar1,pcVar1 + pbVar9->_M_string_length);
              if (local_60._M_string_length == 0) {
                sVar8 = 0;
              }
              else {
                sVar8 = local_60._M_string_length;
                if (local_60._M_dataplus._M_p[local_60._M_string_length - 1] != '/') {
                  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_88,local_60._M_dataplus._M_p,
                             local_60._M_dataplus._M_p + local_60._M_string_length);
                  std::__cxx11::string::append((char *)&local_88);
                  std::__cxx11::string::operator=((string *)&local_60,(string *)&local_88);
                  sVar8 = local_60._M_string_length;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) {
                    operator_delete(local_88._M_dataplus._M_p,
                                    local_88.field_2._M_allocated_capacity + 1);
                    sVar8 = local_60._M_string_length;
                  }
                }
              }
              local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_88,local_60._M_dataplus._M_p,
                         local_60._M_dataplus._M_p + sVar8);
              std::__cxx11::string::append((char *)&local_88);
              std::__cxx11::string::operator=((string *)&local_60,(string *)&local_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              psVar7 = cmSourceFile::GetFullPath(local_38,(string *)0x0);
              sVar5 = psVar7->_M_string_length;
              if (sVar5 == local_60._M_string_length) {
                if (sVar5 != 0) {
                  uVar4 = bcmp((psVar7->_M_dataplus)._M_p,local_60._M_dataplus._M_p,sVar5);
                  psVar7 = (string *)(ulong)uVar4;
                  if (uVar4 != 0) goto LAB_00478cbd;
                }
                local_64 = (uint)CONCAT71((int7)((ulong)psVar7 >> 8),1);
                std::__cxx11::string::_M_assign(local_40);
              }
LAB_00478cbd:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
              pbVar9 = pbVar9 + 1;
            } while (pbVar9 != (this->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
      }
      if ((local_64 & 1) == 0) {
        bVar2 = cmsys::RegularExpression::find
                          (&this->ComplainFileRegularExpression,(info->IncludeName)._M_dataplus._M_p
                          );
        if (bVar2) {
          cmSystemTools::Error
                    ("error cannot find dependencies for ",filename,(char *)0x0,(char *)0x0);
        }
        else {
          std::__cxx11::string::_M_replace
                    ((ulong)local_40,0,(char *)(info->FullPath)._M_string_length,0x5e12e9);
        }
      }
    }
    else {
      do {
        (*this->_vptr_cmMakeDepend[5])(this,info,(pbVar9->_M_dataplus)._M_p);
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != (pcVar6->Depends).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void cmMakeDepend::GenerateDependInformation(cmDependInformation* info)
{
  // If dependencies are already done, stop now.
  if(info->DependDone)
    {
    return;
    }
  else
    {
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;
    }
  const char* path = info->FullPath.c_str();
  if(!path)
    {
    cmSystemTools::Error(
      "Attempt to find dependencies for file without path!");
    return;
    }

  bool found = false;

  // If the file exists, use it to find dependency information.
  if(cmSystemTools::FileExists(path, true))
    {
    // Use the real file to find its dependencies.
    this->DependWalk(info);
    found = true;
    }


  // See if the cmSourceFile for it has any files specified as
  // dependency hints.
  if(info->SourceFile != 0)
    {

    // Get the cmSourceFile corresponding to this.
    const cmSourceFile& cFile = *(info->SourceFile);
    // See if there are any hints for finding dependencies for the missing
    // file.
    if(!cFile.GetDepends().empty())
      {
      // Dependency hints have been given.  Use them to begin the
      // recursion.
      for(std::vector<std::string>::const_iterator file =
            cFile.GetDepends().begin(); file != cFile.GetDepends().end();
          ++file)
        {
        this->AddDependency(info, file->c_str());
        }

      // Found dependency information.  We are done.
      found = true;
      }
    }

  if(!found)
    {
    // Try to find the file amongst the sources
    cmSourceFile *srcFile = this->Makefile->GetSource
      (cmSystemTools::GetFilenameWithoutExtension(path));
    if (srcFile)
      {
      if (srcFile->GetFullPath() == path)
        {
        found=true;
        }
      else
        {
        //try to guess which include path to use
        for(std::vector<std::string>::iterator t =
              this->IncludeDirectories.begin();
            t != this->IncludeDirectories.end(); ++t)
          {
          std::string incpath = *t;
          if (!incpath.empty() && incpath[incpath.size() - 1] != '/')
            {
            incpath = incpath + "/";
            }
          incpath = incpath + path;
          if (srcFile->GetFullPath() == incpath)
            {
            // set the path to the guessed path
            info->FullPath = incpath;
            found=true;
            }
          }
        }
      }
    }

  if(!found)
    {
    // Couldn't find any dependency information.
    if(this->ComplainFileRegularExpression.find(info->IncludeName.c_str()))
      {
      cmSystemTools::Error("error cannot find dependencies for ", path);
      }
    else
      {
      // Destroy the name of the file so that it won't be output as a
      // dependency.
      info->FullPath = "";
      }
    }
}